

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLError __thiscall tinyxml2::XMLDocument::SaveFile(XMLDocument *this,char *filename,bool compact)

{
  FILE *__stream;
  
  if (filename == (char *)0x0) {
    SetError(this,XML_ERROR_FILE_COULD_NOT_BE_OPENED,0,"filename=<null>");
  }
  else {
    __stream = fopen(filename,"w");
    if (__stream == (FILE *)0x0) {
      SetError(this,XML_ERROR_FILE_COULD_NOT_BE_OPENED,0,"filename=%s",filename);
    }
    else {
      SaveFile(this,(FILE *)__stream,compact);
      fclose(__stream);
    }
  }
  return this->_errorID;
}

Assistant:

XMLError XMLDocument::SaveFile( const char* filename, bool compact )
{
    if ( !filename ) {
        TIXMLASSERT( false );
        SetError( XML_ERROR_FILE_COULD_NOT_BE_OPENED, 0, "filename=<null>" );
        return _errorID;
    }

    FILE* fp = callfopen( filename, "w" );
    if ( !fp ) {
        SetError( XML_ERROR_FILE_COULD_NOT_BE_OPENED, 0, "filename=%s", filename );
        return _errorID;
    }
    SaveFile(fp, compact);
    fclose( fp );
    return _errorID;
}